

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O1

double __thiscall
ProblemDecTigerWithCreaks::GetObsProb
          (ProblemDecTigerWithCreaks *this,Index ja,Index s,Index agentI,Index oI)

{
  Index IVar1;
  E *this_00;
  
  if (agentI != 1) {
    if (agentI != 0) goto switchD_003e4536_default;
    switch(oI) {
    case 0:
      IVar1 = GetJointActionIndex(this,0,0);
      if (IVar1 != ja) {
        IVar1 = GetJointActionIndex(this,2,2);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,1,1);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,2,1);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,1,2);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,0,2);
        if (IVar1 != ja) {
          IVar1 = GetJointActionIndex(this,2,0);
          if (IVar1 == ja) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex(this,0,1);
          if (IVar1 == ja) {
            if (s == 0) {
              return 0.765;
            }
            if (s == 1) {
              return 0.135;
            }
          }
          else {
            IVar1 = GetJointActionIndex(this,1,0);
            if (IVar1 == ja) {
              return 0.16666666666666666;
            }
          }
          break;
        }
      }
      if (s == 0) {
        return 0.0425;
      }
      if (s == 1) {
        return 0.0075;
      }
      break;
    case 1:
      break;
    case 2:
      goto switchD_003e4536_caseD_2;
    case 3:
      goto switchD_003e4536_caseD_3;
    case 4:
      goto switchD_003e4536_caseD_4;
    case 5:
      goto switchD_003e4536_caseD_5;
    default:
      goto switchD_003e4536_default;
    }
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
LAB_003e4571:
      if (s == 0) {
        return 0.0425;
      }
      if (s == 1) {
        return 0.0075;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 == ja) {
        if (s == 0) {
          return 0.765;
        }
        if (s == 1) {
          return 0.135;
        }
      }
      else {
        IVar1 = GetJointActionIndex(this,2,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,0,1);
        if (IVar1 == ja) goto LAB_003e4571;
        IVar1 = GetJointActionIndex(this,1,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
      }
    }
switchD_003e4536_caseD_2:
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
      if (s == 0) {
        return 0.765;
      }
      if (s == 1) {
        return 0.135;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 != ja) {
        IVar1 = GetJointActionIndex(this,2,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,0,1);
        if (IVar1 != ja) {
          IVar1 = GetJointActionIndex(this,1,0);
          if (IVar1 == ja) {
            return 0.16666666666666666;
          }
          goto switchD_003e4536_caseD_3;
        }
      }
      if (s == 0) {
        return 0.0425;
      }
      if (s == 1) {
        return 0.0075;
      }
    }
switchD_003e4536_caseD_3:
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
LAB_003e45bb:
      if (s == 0) {
        return 0.0075;
      }
      if (s == 1) {
        return 0.0425;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 == ja) goto LAB_003e45bb;
      IVar1 = GetJointActionIndex(this,2,0);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        if (s == 0) {
          return 0.135;
        }
        if (s == 1) {
          return 0.765;
        }
      }
      else {
        IVar1 = GetJointActionIndex(this,1,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
      }
    }
switchD_003e4536_caseD_4:
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
LAB_003e45e0:
      if (s == 0) {
        return 0.0075;
      }
      if (s == 1) {
        return 0.0425;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 == ja) {
        if (s == 0) {
          return 0.135;
        }
        if (s == 1) {
          return 0.765;
        }
      }
      else {
        IVar1 = GetJointActionIndex(this,2,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,0,1);
        if (IVar1 == ja) goto LAB_003e45e0;
        IVar1 = GetJointActionIndex(this,1,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
      }
    }
switchD_003e4536_caseD_5:
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
      if (s == 0) {
        return 0.135;
      }
      if (s == 1) {
        return 0.765;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 != ja) {
        IVar1 = GetJointActionIndex(this,2,0);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,0,1);
        if (IVar1 != ja) {
          IVar1 = GetJointActionIndex(this,1,0);
          if (IVar1 == ja) {
            return 0.16666666666666666;
          }
          goto code_r0x003e4620;
        }
      }
      if (s == 0) {
        return 0.0075;
      }
      if (s == 1) {
        return 0.0425;
      }
    }
  }
code_r0x003e4620:
  switch(oI) {
  case 0:
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 != ja) {
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,2,0);
      if (IVar1 != ja) {
        IVar1 = GetJointActionIndex(this,0,1);
        if (IVar1 == ja) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex(this,1,0);
        if (IVar1 == ja) {
          if (s == 0) {
            return 0.765;
          }
          if (s == 1) {
            return 0.135;
          }
        }
        break;
      }
    }
    if (s == 0) {
      return 0.0425;
    }
    if (s == 1) {
      return 0.0075;
    }
    break;
  case 1:
    break;
  case 2:
    goto switchD_003e462e_caseD_2;
  case 3:
    goto switchD_003e462e_caseD_3;
  case 4:
    goto switchD_003e462e_caseD_4;
  case 5:
    goto switchD_003e462e_caseD_5;
  default:
    goto switchD_003e4536_default;
  }
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
LAB_003e4669:
    if (s == 0) {
      return 0.0425;
    }
    if (s == 1) {
      return 0.0075;
    }
  }
  else {
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 == ja) {
      if (s == 0) {
        return 0.765;
      }
      if (s == 1) {
        return 0.135;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,0);
      if (IVar1 == ja) goto LAB_003e4669;
    }
  }
switchD_003e462e_caseD_2:
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
    if (s == 0) {
      return 0.765;
    }
    if (s == 1) {
      return 0.135;
    }
  }
  else {
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 != ja) {
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,0);
      if (IVar1 != ja) goto switchD_003e462e_caseD_3;
    }
    if (s == 0) {
      return 0.0425;
    }
    if (s == 1) {
      return 0.0075;
    }
  }
switchD_003e462e_caseD_3:
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
LAB_003e46af:
    if (s == 0) {
      return 0.0075;
    }
    if (s == 1) {
      return 0.0425;
    }
  }
  else {
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 == ja) goto LAB_003e46af;
    IVar1 = GetJointActionIndex(this,0,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,0);
    if (IVar1 == ja) {
      if (s == 0) {
        return 0.135;
      }
      if (s == 1) {
        return 0.765;
      }
    }
  }
switchD_003e462e_caseD_4:
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
LAB_003e46cc:
    if (s == 0) {
      return 0.0075;
    }
    if (s == 1) {
      return 0.0425;
    }
  }
  else {
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 == ja) {
      if (s == 0) {
        return 0.135;
      }
      if (s == 1) {
        return 0.765;
      }
    }
    else {
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,0);
      if (IVar1 == ja) goto LAB_003e46cc;
    }
  }
switchD_003e462e_caseD_5:
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
    if (s == 0) {
      return 0.135;
    }
    if (s == 1) {
      return 0.765;
    }
  }
  else {
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if ((((IVar1 == ja) || (IVar1 = GetJointActionIndex(this,2,1), IVar1 == ja)) ||
        (IVar1 = GetJointActionIndex(this,1,2), IVar1 == ja)) ||
       (IVar1 = GetJointActionIndex(this,0,2), IVar1 == ja)) {
      return 0.16666666666666666;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 != ja) {
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex(this,1,0);
      if (IVar1 != ja) goto switchD_003e4536_default;
    }
    if (s == 0) {
      return 0.0075;
    }
    if (s == 1) {
      return 0.0425;
    }
  }
switchD_003e4536_default:
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"ProblemDecTigerWithCreaks::GetObsProb should never get here");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

double ProblemDecTigerWithCreaks::GetObsProb(Index ja,
                                             Index s,
                                             Index agentI,
                                             Index oI) const
{
    switch(agentI)
    {
    case 0:
        switch(oI)
        {
        case GROWLLEFT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLLEFT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLLEFT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        }
    case 1:
        switch(oI)
        {
        case GROWLLEFT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
        case GROWLLEFT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
        case GROWLLEFT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
        case GROWLRIGHT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
        case GROWLRIGHT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
        case GROWLRIGHT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
        }
    }

    throw(E("ProblemDecTigerWithCreaks::GetObsProb should never get here"));
    return(42);
}